

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O1

void wasm::
     CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::
     scan(CoalesceLocals *self,Expression **currp)

{
  Id IVar1;
  Expression *curr;
  Module *pMVar2;
  bool bVar3;
  char *__function;
  LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *pLVar4;
  code *pcVar5;
  uint uVar6;
  ulong uVar7;
  
  curr = *currp;
  IVar1 = curr->_id;
  if (TableInitId < IVar1) {
    if (IVar1 < SuspendId) {
      switch(IVar1) {
      case TryId:
        pLVar4 = &(self->
                  super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                  ).
                  super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
        ;
        Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::pushTask
                  ((Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *)
                   pLVar4,doEndTry,currp);
        if (curr->_id == TryId) {
          if (*(long *)(curr + 5) != 0) {
            uVar6 = 1;
            uVar7 = 0;
            do {
              Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::pushTask
                        ((Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *
                         )pLVar4,doEndCatch,currp);
              if (*(ulong *)(curr + 5) <= uVar7) {
                __assert_fail("index < usedElements",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                              ,0xbc,
                              "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                             );
              }
              Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::pushTask
                        ((Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *
                         )pLVar4,scan,(Expression **)(uVar7 * 8 + curr[4].type.id));
              Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::pushTask
                        ((Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *
                         )pLVar4,doStartCatch,currp);
              uVar7 = (ulong)uVar6;
              uVar6 = uVar6 + 1;
            } while (uVar7 < *(ulong *)(curr + 5));
          }
          Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::pushTask
                    ((Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *)
                     pLVar4,doStartCatches,currp);
          if (curr->_id == TryId) {
            Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::pushTask
                      ((Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *)
                       pLVar4,scan,(Expression **)(curr + 2));
            pcVar5 = doStartTry;
            goto LAB_007f16d6;
          }
        }
        __function = "T *wasm::Expression::cast() [T = wasm::Try]";
        goto LAB_007f1743;
      case TryTableId:
        pcVar5 = doEndTryTable;
        break;
      case ThrowId:
      case RethrowId:
      case ThrowRefId:
        pcVar5 = doEndThrow;
        break;
      default:
        goto switchD_007f1433_caseD_39;
      case CallRefId:
        goto switchD_007f1433_caseD_3d;
      case BrOnId:
        goto switchD_007f1433_caseD_40;
      }
    }
    else {
      if (1 < IVar1 - 0x5d) {
        if ((IVar1 != SuspendId) && (IVar1 != StackSwitchId)) goto switchD_007f1433_caseD_39;
        pMVar2 = (self->
                 super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                 ).
                 super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                 .
                 super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                 .super_PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                 .super_Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
                 currModule;
        if ((pMVar2 == (Module *)0x0) || (((pMVar2->features).features & 0x40) != 0))
        goto LAB_007f14d2;
        goto LAB_007f169f;
      }
      pcVar5 = doEndResume;
    }
    goto LAB_007f1697;
  }
  switch(IVar1) {
  case BlockId:
    pcVar5 = doEndBlock;
    break;
  case IfId:
    pLVar4 = &(self->
              super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
              ).
              super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
    ;
    Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::pushTask
              ((Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *)pLVar4,
               doEndIf,currp);
    if (curr->_id == IfId) {
      if (*(long *)(curr + 2) != 0) {
        Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::pushTask
                  ((Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *)
                   pLVar4,scan,(Expression **)(curr + 2));
        Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::pushTask
                  ((Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *)
                   pLVar4,doStartIfFalse,currp);
      }
      if (curr->_id == IfId) {
        Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::pushTask
                  ((Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *)
                   pLVar4,scan,(Expression **)&curr[1].type);
        Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::pushTask
                  ((Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *)
                   pLVar4,doStartIfTrue,currp);
        if (curr->_id == IfId) {
          currp = (Expression **)(curr + 1);
          pcVar5 = scan;
          goto LAB_007f16d6;
        }
      }
    }
    __function = "T *wasm::Expression::cast() [T = wasm::If]";
LAB_007f1743:
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                  ,0x31b,__function);
  case LoopId:
    pcVar5 = doEndLoop;
    break;
  case BreakId:
  case SwitchId:
switchD_007f1433_caseD_40:
    pcVar5 = doEndBranch;
    break;
  case CallId:
  case CallIndirectId:
switchD_007f1433_caseD_3d:
    bVar3 = isReturnCall(curr);
    if (bVar3) goto LAB_007f15ad;
    pMVar2 = (self->
             super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
             ).
             super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
             super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
             .super_PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
             super_Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
             currModule;
    if ((pMVar2 != (Module *)0x0) && (((pMVar2->features).features & 0x40) == 0)) goto LAB_007f169f;
LAB_007f14d2:
    pcVar5 = doEndCall;
    break;
  default:
switchD_007f1433_caseD_39:
    if ((curr->type).id == 1) {
      pcVar5 = doStartUnreachableBlock;
      break;
    }
    goto LAB_007f169f;
  case ReturnId:
LAB_007f15ad:
    pcVar5 = doEndReturn;
  }
LAB_007f1697:
  Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::pushTask
            ((Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *)
             &(self->
              super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
              ).
              super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
             ,pcVar5,currp);
LAB_007f169f:
  PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::scan(self,currp);
  if (curr->_id == TryTableId) {
    pcVar5 = doStartTryTable;
  }
  else {
    if (curr->_id != LoopId) {
      return;
    }
    pcVar5 = doStartLoop;
  }
LAB_007f16d6:
  Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::pushTask
            ((Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *)
             &(self->
              super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
              ).
              super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
             ,pcVar5,currp);
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

    switch (curr->_id) {
      case Expression::Id::BlockId: {
        self->pushTask(SubType::doEndBlock, currp);
        break;
      }
      case Expression::Id::IfId: {
        self->pushTask(SubType::doEndIf, currp);
        auto* ifFalse = curr->cast<If>()->ifFalse;
        if (ifFalse) {
          self->pushTask(SubType::scan, &curr->cast<If>()->ifFalse);
          self->pushTask(SubType::doStartIfFalse, currp);
        }
        self->pushTask(SubType::scan, &curr->cast<If>()->ifTrue);
        self->pushTask(SubType::doStartIfTrue, currp);
        self->pushTask(SubType::scan, &curr->cast<If>()->condition);
        return; // don't do anything else
      }
      case Expression::Id::LoopId: {
        self->pushTask(SubType::doEndLoop, currp);
        break;
      }
      case Expression::Id::CallId:
      case Expression::Id::CallIndirectId:
      case Expression::Id::CallRefId: {
        if (isReturnCall(curr)) {
          self->pushTask(SubType::doEndReturn, currp);
        } else {
          auto* module = self->getModule();
          if (!module || module->features.hasExceptionHandling()) {
            // This call might throw, so run the code to handle that.
            self->pushTask(SubType::doEndCall, currp);
          }
        }
        break;
      }
      case Expression::Id::ReturnId:
        self->pushTask(SubType::doEndReturn, currp);
        break;
      case Expression::Id::TryId: {
        self->pushTask(SubType::doEndTry, currp);
        auto& catchBodies = curr->cast<Try>()->catchBodies;
        for (Index i = 0; i < catchBodies.size(); i++) {
          self->pushTask(doEndCatch, currp);
          self->pushTask(SubType::scan, &catchBodies[i]);
          self->pushTask(doStartCatch, currp);
        }
        self->pushTask(SubType::doStartCatches, currp);
        self->pushTask(SubType::scan, &curr->cast<Try>()->body);
        self->pushTask(SubType::doStartTry, currp);
        return; // don't do anything else
      }
      case Expression::Id::TryTableId: {
        self->pushTask(SubType::doEndTryTable, currp);
        break;
      }
      case Expression::Id::ThrowId:
      case Expression::Id::RethrowId:
      case Expression::Id::ThrowRefId: {
        self->pushTask(SubType::doEndThrow, currp);
        break;
      }
      case Expression::Id::ResumeId:
      case Expression::Id::ResumeThrowId: {
        self->pushTask(SubType::doEndResume, currp);
        break;
      }
      case Expression::Id::SuspendId:
      case Expression::Id::StackSwitchId: {
        auto* module = self->getModule();
        if (!module || module->features.hasExceptionHandling()) {
          // This might throw, so run the code to handle that.
          self->pushTask(SubType::doEndCall, currp);
        }
        break;
      }
      default: {
        if (Properties::isBranch(curr)) {
          self->pushTask(SubType::doEndBranch, currp);
        } else if (curr->type == Type::unreachable) {
          self->pushTask(SubType::doStartUnreachableBlock, currp);
        }
      }
    }

    PostWalker<SubType, VisitorType>::scan(self, currp);

    switch (curr->_id) {
      case Expression::Id::LoopId: {
        self->pushTask(SubType::doStartLoop, currp);
        break;
      }
      case Expression::Id::TryTableId: {
        self->pushTask(SubType::doStartTryTable, currp);
        break;
      }
      default: {}
    }
  }